

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O2

SurfaceInteraction * __thiscall
pbrt::Disk::InteractionFromIntersection
          (SurfaceInteraction *__return_storage_ptr__,Disk *this,QuadricIntersection *isect,
          Vector3f *wo,Float time)

{
  float fVar1;
  bool bVar2;
  bool bVar3;
  Transform *this_00;
  undefined1 auVar4 [16];
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar8 [56];
  undefined1 auVar7 [64];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Vector3<float> VVar11;
  Tuple3<pbrt::Normal3,_float> local_1e0;
  Tuple3<pbrt::Normal3,_float> local_1d0;
  Tuple3<pbrt::Vector3,_float> local_1c0;
  Vector3f local_1b4;
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  Tuple2<pbrt::Point2,_float> local_178;
  Tuple3<pbrt::Vector3,_float> local_170;
  Tuple3<pbrt::Vector3,_float> local_160;
  Point3f pHit;
  Point3fi local_140;
  SurfaceInteraction local_128;
  
  pHit.super_Tuple3<pbrt::Point3,_float>.x = (isect->pObj).super_Tuple3<pbrt::Point3,_float>.x;
  pHit.super_Tuple3<pbrt::Point3,_float>.y = (isect->pObj).super_Tuple3<pbrt::Point3,_float>.y;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = pHit.super_Tuple3<pbrt::Point3,_float>._0_8_;
  fVar1 = this->radius;
  local_1b4.super_Tuple3<pbrt::Vector3,_float>.y = this->phiMax;
  auVar4._8_4_ = 0x80000000;
  auVar4._0_8_ = 0x8000000080000000;
  auVar4._12_4_ = 0x80000000;
  auVar6 = vxorps_avx512vl(ZEXT416((uint)local_1b4.super_Tuple3<pbrt::Vector3,_float>.y),auVar4);
  auVar4 = vmovshdup_avx(auVar10);
  fVar5 = this->innerRadius - fVar1;
  local_1a8 = ZEXT416((uint)local_1b4.super_Tuple3<pbrt::Vector3,_float>.y);
  local_1b4.super_Tuple3<pbrt::Vector3,_float>.x = auVar4._0_4_;
  local_188 = ZEXT416((uint)(fVar1 - this->innerRadius));
  local_1b4.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  auVar4 = vfmadd231ss_fma(ZEXT416((uint)(local_1b4.super_Tuple3<pbrt::Vector3,_float>.x *
                                         local_1b4.super_Tuple3<pbrt::Vector3,_float>.x)),auVar10,
                           auVar10);
  local_1d0.x = 0.0;
  local_1d0.y = 0.0;
  local_1d0.z = 0.0;
  auVar4 = vsqrtss_avx(auVar4,auVar4);
  local_1c0.z = auVar4._0_4_;
  local_198 = vinsertps_avx(ZEXT416((uint)isect->phi),ZEXT416((uint)(fVar1 - local_1c0.z)),0x10);
  local_1b4.super_Tuple3<pbrt::Vector3,_float>.y =
       local_1b4.super_Tuple3<pbrt::Vector3,_float>.y *
       (float)pHit.super_Tuple3<pbrt::Point3,_float>.x;
  local_1b4.super_Tuple3<pbrt::Vector3,_float>.x =
       local_1b4.super_Tuple3<pbrt::Vector3,_float>.x * auVar6._0_4_;
  auVar9._4_4_ = local_1c0.z;
  auVar9._0_4_ = local_1c0.z;
  auVar9._8_4_ = local_1c0.z;
  auVar9._12_4_ = local_1c0.z;
  auVar6._0_4_ = fVar5 * (float)pHit.super_Tuple3<pbrt::Point3,_float>.x;
  auVar6._4_4_ = fVar5 * (float)pHit.super_Tuple3<pbrt::Point3,_float>.y;
  auVar6._8_4_ = fVar5 * 0.0;
  auVar6._12_4_ = fVar5 * 0.0;
  auVar4 = vdivps_avx(auVar6,auVar9);
  local_1c0.z = (fVar5 * 0.0) / local_1c0.z;
  local_1c0._0_8_ = vmovlps_avx(auVar4);
  local_1e0.x = 0.0;
  local_1e0.y = 0.0;
  local_1e0.z = 0.0;
  pHit.super_Tuple3<pbrt::Point3,_float>.z = this->height;
  auVar8 = (undefined1  [56])0x0;
  local_160.x = 0.0;
  local_160.y = 0.0;
  local_160.z = 0.0;
  bVar2 = this->reverseOrientation;
  bVar3 = this->transformSwapsHandedness;
  VVar11 = Transform::operator()(this->objectFromRender,wo);
  local_170.z = VVar11.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar7._0_8_ = VVar11.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar7._8_56_ = auVar8;
  local_170._0_8_ = vmovlps_avx(auVar7._0_16_);
  this_00 = this->renderFromObject;
  Point3fi::Point3fi(&local_140,&pHit,(Vector3f *)&local_160);
  auVar4 = vinsertps_avx(local_1a8,ZEXT416((uint)local_188._0_4_),0x10);
  auVar4 = vdivps_avx(local_198,auVar4);
  local_178 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar4);
  SurfaceInteraction::SurfaceInteraction
            (&local_128,&local_140,(Point2f *)&local_178,(Vector3f *)&local_170,&local_1b4,
             (Vector3f *)&local_1c0,(Normal3f *)&local_1d0,(Normal3f *)&local_1e0,time,
             bVar2 != bVar3);
  Transform::operator()(__return_storage_ptr__,this_00,&local_128);
  return __return_storage_ptr__;
}

Assistant:

InteractionFromIntersection(const QuadricIntersection &isect,
                                                   const Vector3f &wo, Float time) const {
        Point3f pHit = isect.pObj;
        Float phi = isect.phi;
        // Find parametric representation of disk hit
        Float u = phi / phiMax;
        Float rHit = std::sqrt(pHit.x * pHit.x + pHit.y * pHit.y);
        Float v = (radius - rHit) / (radius - innerRadius);
        Vector3f dpdu(-phiMax * pHit.y, phiMax * pHit.x, 0);
        Vector3f dpdv = Vector3f(pHit.x, pHit.y, 0.) * (innerRadius - radius) / rHit;
        Normal3f dndu(0, 0, 0), dndv(0, 0, 0);

        // Refine disk intersection point
        pHit.z = height;

        // Compute error bounds for disk intersection
        Vector3f pError(0, 0, 0);

        // Return _SurfaceInteraction_ for quadric intersection
        bool flipNormal = reverseOrientation ^ transformSwapsHandedness;
        Vector3f woObject = (*objectFromRender)(wo);
        return (*renderFromObject)(SurfaceInteraction(Point3fi(pHit, pError),
                                                      Point2f(u, v), woObject, dpdu, dpdv,
                                                      dndu, dndv, time, flipNormal));
    }